

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

int ndn_unix_face_send(ndn_face_intf_t *self,uint8_t *packet,uint32_t size)

{
  ulong uVar1;
  ssize_t ret;
  ndn_unix_face_t *ptr;
  uint32_t size_local;
  uint8_t *packet_local;
  ndn_face_intf_t *self_local;
  
  uVar1 = send(*(int *)&self[4].up,packet,(ulong)size,0);
  if (uVar1 == size) {
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = 2;
  }
  return self_local._4_4_;
}

Assistant:

static int
ndn_unix_face_send(ndn_face_intf_t* self, const uint8_t* packet, uint32_t size){
  ndn_unix_face_t* ptr = container_of(self, ndn_unix_face_t, intf);
  ssize_t ret;
  ret = send(ptr->sock, packet, size, 0);
  if(ret != size){
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }else{
    return NDN_SUCCESS;
  }
}